

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeAddGtuMemoryTrap
          (Replacer *this,Expression *leftOperand,Expression *rightOperand,Name memory)

{
  Name target;
  mapped_type *pmVar1;
  reference pvVar2;
  Call *limit;
  Expression *pEVar3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_88;
  Expression *local_68;
  char *pcStack_60;
  Expression *gtuMemoryTrap;
  Name memorySizeFunc;
  mapped_type memoryIdx;
  Expression *rightOperand_local;
  Expression *leftOperand_local;
  Replacer *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  pmVar1 = std::
           unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
           ::at(&this->parent->memoryIdxMap,(key_type *)&this_local);
  memorySizeFunc.super_IString.str._M_str._4_4_ = *pmVar1;
  pvVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                     (&this->parent->memorySizeNames,
                      (ulong)memorySizeFunc.super_IString.str._M_str._4_4_);
  local_68 = (Expression *)(pvVar2->super_IString).str._M_len;
  pcStack_60 = (pvVar2->super_IString).str._M_str;
  local_88.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gtuMemoryTrap = local_68;
  memorySizeFunc.super_IString.str._M_len = (size_t)pcStack_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_88);
  target.super_IString.str._M_str = pcStack_60;
  target.super_IString.str._M_len = (size_t)local_68;
  limit = Builder::makeCall(&this->builder,target,&local_88,(Type)(this->parent->pointerType).id,
                            false);
  pEVar3 = makeAddGtuTrap(this,leftOperand,rightOperand,(Expression *)limit);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_88);
  return pEVar3;
}

Assistant:

Expression* makeAddGtuMemoryTrap(Expression* leftOperand,
                                     Expression* rightOperand,
                                     Name memory) {
      auto memoryIdx = parent.memoryIdxMap.at(memory);
      Name memorySizeFunc = parent.memorySizeNames[memoryIdx];
      Expression* gtuMemoryTrap = makeAddGtuTrap(
        leftOperand,
        rightOperand,
        builder.makeCall(memorySizeFunc, {}, parent.pointerType));
      return gtuMemoryTrap;
    }